

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  LRUHandle *pLVar1;
  LRUHandle *pLVar2;
  LRUHandle *pLVar3;
  LRUCache *pLVar4;
  long lVar5;
  LRUHandle *pLVar6;
  LRUCache *this_00;
  LRUHandle *this_01;
  MutexLock l;
  MutexLock local_58;
  LRUCache *local_50;
  long local_48;
  Slice local_40;
  
  local_50 = this->shard_;
  lVar5 = 0;
  while (pLVar4 = local_50, lVar5 != 0x10) {
    this_00 = local_50 + lVar5;
    local_58.mu_ = &local_50[lVar5].mutex_;
    local_48 = lVar5;
    port::Mutex::Lock(local_58.mu_);
    pLVar6 = &pLVar4[lVar5].lru_;
    pLVar1 = pLVar6->next;
    while (this_01 = pLVar1, this_01 != pLVar6) {
      pLVar1 = this_01->next;
      if (this_01->refs == 1) {
        local_40 = LRUHandle::key(this_01);
        HandleTable::Remove(&pLVar4[lVar5].table_,&local_40,this_01->hash);
        pLVar2 = this_01->next;
        pLVar3 = this_01->prev;
        pLVar2->prev = pLVar3;
        pLVar3->next = pLVar2;
        LRUCache::Unref(this_00,this_01);
      }
    }
    MutexLock::~MutexLock(&local_58);
    lVar5 = local_48 + 1;
  }
  return;
}

Assistant:

virtual void Prune() {
                for (int s = 0; s < kNumShards; s++) {
                    shard_[s].Prune();
                }
            }